

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

void duckdb::DisabledCompressionMethodsSetting::SetGlobal
               (DatabaseInstance *db,DBConfig *config,Value *input)

{
  bool bVar1;
  InvalidInputException *pIVar2;
  pointer str;
  allocator local_e2;
  CompressionType compression_type;
  DBConfig *local_e0;
  string local_d8;
  string param;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> list
  ;
  set<duckdb::CompressionType,_std::less<duckdb::CompressionType>,_std::allocator<duckdb::CompressionType>_>
  disabled_compression_methods;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_e0 = config;
  Value::ToString_abi_cxx11_((string *)&disabled_compression_methods,input);
  ::std::__cxx11::string::string((string *)&param,",",(allocator *)&local_d8);
  StringUtil::Split(&list,(string *)&disabled_compression_methods,&param);
  ::std::__cxx11::string::~string((string *)&param);
  ::std::__cxx11::string::~string((string *)&disabled_compression_methods);
  disabled_compression_methods._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &disabled_compression_methods._M_t._M_impl.super__Rb_tree_header._M_header;
  disabled_compression_methods._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  disabled_compression_methods._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  disabled_compression_methods._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  str = list.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  disabled_compression_methods._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       disabled_compression_methods._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (str == list.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00430b31:
      ::std::
      _Rb_tree<duckdb::CompressionType,_duckdb::CompressionType,_std::_Identity<duckdb::CompressionType>,_std::less<duckdb::CompressionType>,_std::allocator<duckdb::CompressionType>_>
      ::operator=(&(local_e0->options).disabled_compression_methods._M_t,
                  &disabled_compression_methods._M_t);
      ::std::
      _Rb_tree<duckdb::CompressionType,_duckdb::CompressionType,_std::_Identity<duckdb::CompressionType>,_std::less<duckdb::CompressionType>,_std::allocator<duckdb::CompressionType>_>
      ::~_Rb_tree(&disabled_compression_methods._M_t);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&list);
      return;
    }
    StringUtil::Lower(&param,str);
    StringUtil::Trim(&param);
    if (param._M_string_length != 0) {
      bVar1 = ::std::operator==(&param,"none");
      if (bVar1) {
        ::std::
        _Rb_tree<duckdb::CompressionType,_duckdb::CompressionType,_std::_Identity<duckdb::CompressionType>,_std::less<duckdb::CompressionType>,_std::allocator<duckdb::CompressionType>_>
        ::clear(&disabled_compression_methods._M_t);
        ::std::__cxx11::string::~string((string *)&param);
        goto LAB_00430b31;
      }
      compression_type = CompressionTypeFromString(&param);
      if (compression_type == COMPRESSION_AUTO) {
        pIVar2 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_d8,"Unrecognized compression method \"%s\"",&local_e2);
        ::std::__cxx11::string::string((string *)&local_50,(string *)str);
        InvalidInputException::InvalidInputException<std::__cxx11::string>
                  (pIVar2,&local_d8,&local_50);
        __cxa_throw(pIVar2,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (compression_type == COMPRESSION_UNCOMPRESSED) {
        pIVar2 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_d8,"Uncompressed compression cannot be disabled",&local_e2);
        InvalidInputException::InvalidInputException(pIVar2,&local_d8);
        __cxa_throw(pIVar2,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::
      _Rb_tree<duckdb::CompressionType,duckdb::CompressionType,std::_Identity<duckdb::CompressionType>,std::less<duckdb::CompressionType>,std::allocator<duckdb::CompressionType>>
      ::_M_insert_unique<duckdb::CompressionType_const&>
                ((_Rb_tree<duckdb::CompressionType,duckdb::CompressionType,std::_Identity<duckdb::CompressionType>,std::less<duckdb::CompressionType>,std::allocator<duckdb::CompressionType>>
                  *)&disabled_compression_methods,&compression_type);
    }
    ::std::__cxx11::string::~string((string *)&param);
    str = str + 1;
  } while( true );
}

Assistant:

void DisabledCompressionMethodsSetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	auto list = StringUtil::Split(input.ToString(), ",");
	set<CompressionType> disabled_compression_methods;
	for (auto &entry : list) {
		auto param = StringUtil::Lower(entry);
		StringUtil::Trim(param);
		if (param.empty()) {
			continue;
		}
		if (param == "none") {
			disabled_compression_methods.clear();
			break;
		}
		auto compression_type = CompressionTypeFromString(param);
		if (compression_type == CompressionType::COMPRESSION_UNCOMPRESSED) {
			throw InvalidInputException("Uncompressed compression cannot be disabled");
		}
		if (compression_type == CompressionType::COMPRESSION_AUTO) {
			throw InvalidInputException("Unrecognized compression method \"%s\"", entry);
		}
		disabled_compression_methods.insert(compression_type);
	}
	config.options.disabled_compression_methods = std::move(disabled_compression_methods);
}